

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O0

void __thiscall
lf::io::VtkWriter::WriteFieldData<int>
          (VtkWriter *this,string *name,vector<int,_std::allocator<int>_> *data)

{
  value_type local_a8;
  undefined1 auStack_58 [8];
  FieldDataArray<int> vtk_data;
  vector<int,_std::allocator<int>_> *data_local;
  string *name_local;
  VtkWriter *this_local;
  
  vtk_data.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)data;
  CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>,std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>>>
            (this,&(this->vtk_file_).field_data,name);
  vtk_data.name.field_2._8_8_ = 0;
  vtk_data.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vtk_data.name._M_string_length = 0;
  vtk_data.name.field_2._M_allocated_capacity = 0;
  auStack_58 = (undefined1  [8])0x0;
  vtk_data.name._M_dataplus._M_p = (pointer)0x0;
  vtk_data.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  VtkFile::FieldDataArray<int>::FieldDataArray((FieldDataArray<int> *)auStack_58);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58,name);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)((long)&vtk_data.name.field_2 + 8),data);
  boost::
  variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>
  ::variant<lf::io::VtkFile::FieldDataArray<int>>
            ((variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>
              *)&local_a8,(FieldDataArray<int> *)auStack_58,true);
  std::
  vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>
  ::push_back(&(this->vtk_file_).field_data,&local_a8);
  boost::
  variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>
  ::~variant(&local_a8);
  VtkFile::FieldDataArray<int>::~FieldDataArray((FieldDataArray<int> *)auStack_58);
  return;
}

Assistant:

void VtkWriter::WriteFieldData(const std::string& name, std::vector<T> data) {
  CheckAttributeSetName(vtk_file_.field_data, name);
  VtkFile::FieldDataArray<T> vtk_data{};
  vtk_data.name = name;
  vtk_data.data = std::move(data);
  vtk_file_.field_data.push_back(std::move(vtk_data));
}